

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

size_t __thiscall pfederc::Lexer::getLineNumber(Lexer *this,size_t index)

{
  pointer puVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  size_t sVar6;
  size_t sVar7;
  size_type *psVar8;
  char cVar9;
  long *local_58;
  uint local_50;
  long local_48 [2];
  string local_38;
  
  if (this->currentEndIndex < index) {
    cVar9 = '\x01';
    if (9 < index) {
      sVar7 = index;
      cVar4 = '\x04';
      do {
        cVar9 = cVar4;
        if (sVar7 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_00107f0f;
        }
        if (sVar7 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_00107f0f;
        }
        if (sVar7 < 10000) goto LAB_00107f0f;
        bVar2 = 99999 < sVar7;
        sVar7 = sVar7 / 10000;
        cVar4 = cVar9 + '\x04';
      } while (bVar2);
      cVar9 = cVar9 + '\x01';
    }
LAB_00107f0f:
    local_58 = local_48;
    std::__cxx11::string::_M_construct((ulong)&local_58,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_58,local_50,index);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x1200bf);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_38.field_2._M_allocated_capacity = *psVar8;
      local_38.field_2._8_8_ = plVar5[3];
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    }
    else {
      local_38.field_2._M_allocated_capacity = *psVar8;
      local_38._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_38._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    fatal("lexer.cpp",0x46,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    sVar6 = 0;
  }
  else {
    puVar1 = (this->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    sVar7 = (long)(this->lineIndices).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
    do {
      sVar6 = sVar7 - 1;
      lVar3 = sVar7 - 1;
      sVar7 = sVar6;
    } while (index < puVar1[lVar3]);
  }
  return sVar6;
}

Assistant:

size_t Lexer::getLineNumber(size_t index) const noexcept {
  if (index > currentEndIndex) {
    fatal("lexer.cpp", __LINE__, "Out of bounds: " + std::to_string(index));
    return 0;
  }

  size_t lineIndex = lineIndices.size() - 1;
  for (; index < lineIndices[lineIndex]; --lineIndex);

  return lineIndex;
}